

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_tran_msg_props(char *scheme,_func_void_nng_msg_ptr *check)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  nng_url *local_48;
  nng_url *url;
  nng_msg *msg;
  nng_dialer d1;
  nng_listener l1;
  nng_socket s1;
  nng_socket s2;
  
  d1.id = 0;
  l1.id = 0;
  msg._4_4_ = 0;
  msg._0_4_ = 0;
  pcVar4 = strchr(scheme,0x36);
  if (pcVar4 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x1f8,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr(scheme,0x40,nuts_tran_msg_props::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&d1);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1fa,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)&l1);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1fb,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar4
                           ,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms((nng_socket)d1.id,"send-timeout",100);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1fc,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms((nng_socket)l1.id,"send-timeout",100);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x1fd,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms((nng_socket)d1.id,"recv-timeout",100);
          pcVar4 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x1fe,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",100);
            pcVar4 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1ff,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
            if (iVar3 != 0) {
              nVar2 = nng_listen((nng_socket)d1.id,nuts_tran_msg_props::nuts_addr_,
                                 (nng_listener *)((long)&msg + 4),0);
              pcVar4 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x200,"%s: expected success, got %s (%d)",
                                     "nng_listen(s1, addr, &l1, 0)",pcVar4,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_listener_get_url(msg._4_4_,&local_48);
                pcVar4 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x201,"%s: expected success, got %s (%d)",
                                       "nng_listener_get_url(l1, &url)",pcVar4,nVar2);
                if (iVar3 != 0) {
                  nVar2 = nng_dial_url((nng_socket)l1.id,local_48,(nng_dialer *)&msg,0);
                  pcVar4 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x202,"%s: expected success, got %s (%d)",
                                         "nng_dial_url(s2, url, &d1, 0)",pcVar4,nVar2);
                  if (iVar3 != 0) {
                    iVar3 = nng_listener_id(msg._4_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x203,"%s","nng_listener_id(l1) > 0");
                    iVar3 = nng_dialer_id(msg._0_4_);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x204,"%s","nng_dialer_id(d1) > 0");
                    nVar2 = nng_send((nng_socket)d1.id,"ping",5,0);
                    pcVar4 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x205,"%s: expected success, got %s (%d)",
                                           "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",pcVar4,
                                           nVar2);
                    if (iVar3 != 0) {
                      nVar2 = nng_recvmsg((nng_socket)l1.id,(nng_msg **)&url,0);
                      pcVar4 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x206,"%s: expected success, got %s (%d)",
                                             "nng_recvmsg(s2, &msg, 0)",pcVar4,nVar2);
                      if (iVar3 != 0) {
                        pcVar4 = (char *)nng_msg_body((nng_msg *)url);
                        iVar3 = strcmp(pcVar4,"ping");
                        pvVar5 = nng_msg_body((nng_msg *)url);
                        acutest_check_((uint)(iVar3 == 0),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x207,"%s == %s",pvVar5,"ping",nVar2);
                        (*check)((nng_msg *)url);
                        nng_msg_free((nng_msg *)url);
                        nVar2 = nng_socket_close((nng_socket)d1.id);
                        pcVar4 = nng_strerror(nVar2);
                        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x20a,"%s: expected success, got %s (%d)",
                                               "nng_socket_close(s1)",pcVar4,nVar2);
                        if (iVar3 != 0) {
                          nVar2 = nng_socket_close((nng_socket)l1.id);
                          pcVar4 = nng_strerror(nVar2);
                          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                                 ,0x20b,"%s: expected success, got %s (%d)",
                                                 "nng_socket_close(s2)",pcVar4,nVar2);
                          if (iVar3 != 0) {
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_msg_props(const char *scheme, void (*check)(nng_msg *))
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	nng_msg       *msg;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	NUTS_SEND(s1, "ping");
	NUTS_PASS(nng_recvmsg(s2, &msg, 0));
	NUTS_MATCH(nng_msg_body(msg), "ping");
	check(msg);
	nng_msg_free(msg);
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}